

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

bool ctemplate::AnyMightModify
               (vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                *modifiers,PerExpandData *data)

{
  TemplateModifier *pTVar1;
  int iVar2;
  pointer pMVar3;
  bool bVar4;
  string value_string;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pMVar3 = (modifiers->
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar4 = pMVar3 != (modifiers->
                    super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
  if (bVar4) {
    do {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,pMVar3->value,pMVar3->value + pMVar3->value_len);
      pTVar1 = pMVar3->modifier_info->modifier;
      iVar2 = (*pTVar1->_vptr_TemplateModifier[1])(pTVar1,data,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if ((char)iVar2 != '\0') {
        return bVar4;
      }
      pMVar3 = pMVar3 + 1;
      bVar4 = pMVar3 != (modifiers->
                        super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
    } while (bVar4);
  }
  return bVar4;
}

Assistant:

static bool AnyMightModify(const vector<ModifierAndValue>& modifiers,
                           const PerExpandData* data) {
  for (vector<ModifierAndValue>::const_iterator it = modifiers.begin();
       it != modifiers.end();  ++it) {
    string value_string(it->value, it->value_len);
    if (it->modifier_info->modifier->MightModify(data, value_string)) {
      return true;
    }
  }
  return false;
}